

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

void __thiscall
FascodeUtil::msg::print
          (msg *this,MSG_TYPE msgtype,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string message)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (msgtype == ERR) {
    paVar3 = &local_50.field_2;
    pcVar1 = (appname->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + appname->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    pcVar1 = (character->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + character->_M_string_length);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar1 = (label->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + label->_M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,*(long *)message._M_dataplus._M_p,
               *(long *)(message._M_dataplus._M_p + 8) + *(long *)message._M_dataplus._M_p);
    _print(this,(ostream *)&std::cerr,&local_50,&local_d0,&local_f0,color,numberspace,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      _Var2._M_p = local_50._M_dataplus._M_p;
    }
  }
  else {
    paVar3 = &local_70.field_2;
    pcVar1 = (appname->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + appname->_M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar1 = (character->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + character->_M_string_length);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar1 = (label->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + label->_M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,*(long *)message._M_dataplus._M_p,
               *(long *)(message._M_dataplus._M_p + 8) + *(long *)message._M_dataplus._M_p);
    _print(this,(ostream *)&std::cout,&local_70,&local_110,&local_130,color,numberspace,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      _Var2._M_p = local_70._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){
        if(msgtype == ERR){
            _print(std::cerr,appname,character,label,color,numberspace,message);
        }else{
            _print(std::cout,appname,character,label,color,numberspace,message);
        }
    }